

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::FeatureSet::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  
  if (from_msg == to_msg) {
    MergeImpl();
  }
  uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      *(undefined4 *)&to_msg[3]._vptr_MessageLite = *(undefined4 *)&from_msg[3]._vptr_MessageLite;
    }
    if ((uVar1 & 2) != 0) {
      *(undefined4 *)((long)&to_msg[3]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[3]._vptr_MessageLite + 4);
    }
    if ((uVar1 & 4) != 0) {
      *(int *)&to_msg[3]._internal_metadata_.ptr_ = (int)from_msg[3]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 8) != 0) {
      *(undefined4 *)((long)&to_msg[3]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[3]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 0x10) != 0) {
      *(undefined4 *)&to_msg[4]._vptr_MessageLite = *(undefined4 *)&from_msg[4]._vptr_MessageLite;
    }
    if ((uVar1 & 0x20) != 0) {
      *(undefined4 *)((long)&to_msg[4]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[4]._vptr_MessageLite + 4);
    }
    if ((uVar1 & 0x40) != 0) {
      *(int *)&to_msg[4]._internal_metadata_.ptr_ = (int)from_msg[4]._internal_metadata_.ptr_;
    }
    if ((char)uVar1 < '\0') {
      *(undefined4 *)((long)&to_msg[4]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[4]._internal_metadata_.ptr_ + 4);
    }
  }
  *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
  protobuf::internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)(to_msg + 1),(MessageLite *)&_FeatureSet_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void FeatureSet::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FeatureSet*>(&to_msg);
  auto& from = static_cast<const FeatureSet&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FeatureSet)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.field_presence_ = from._impl_.field_presence_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.enum_type_ = from._impl_.enum_type_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.repeated_field_encoding_ = from._impl_.repeated_field_encoding_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.utf8_validation_ = from._impl_.utf8_validation_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.message_encoding_ = from._impl_.message_encoding_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.json_format_ = from._impl_.json_format_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.enforce_naming_style_ = from._impl_.enforce_naming_style_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.default_symbol_visibility_ = from._impl_.default_symbol_visibility_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}